

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNet.cpp
# Opt level: O3

void __thiscall
PyreNet::NeuralNet::NeuralNet
          (NeuralNet *this,int inputSize,
          vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_> *layers)

{
  pointer pLVar1;
  ActivationFactory *this_00;
  pointer pLVar2;
  undefined1 auStack_68 [8];
  vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_> tmp;
  Activation *local_48;
  Activation *activation;
  LayerDefinition layer;
  int prevSize;
  
  (this->layers).super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->layers).super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->layers).super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = ActivationFactory::getInstance();
  this->inputSize = inputSize;
  std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::reserve
            (&this->layers,
             (long)(layers->
                   super__Vector_base<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(layers->
                   super__Vector_base<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3);
  pLVar2 = (layers->
           super__Vector_base<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pLVar1 = (layers->
           super__Vector_base<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pLVar2 != pLVar1) {
    layer.size = inputSize;
    do {
      activation = *(Activation **)pLVar2;
      auStack_68 = (undefined1  [8])0x0;
      tmp.super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      tmp.super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::reserve
                ((vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_> *)auStack_68,
                 (long)activation >> 0x20);
      local_48 = ActivationFactory::getActivation(this_00,(activationType)activation);
      std::vector<PyreNet::Layer,std::allocator<PyreNet::Layer>>::
      emplace_back<int&,int&,PyreNet::Activation*&>
                ((vector<PyreNet::Layer,std::allocator<PyreNet::Layer>> *)&this->layers,
                 (int *)((long)&activation + 4),&layer.size,&local_48);
      layer.size = activation._4_4_;
      std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::~vector
                ((vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_> *)auStack_68);
      pLVar2 = pLVar2 + 1;
    } while (pLVar2 != pLVar1);
  }
  return;
}

Assistant:

NeuralNet::NeuralNet(int inputSize, const std::vector<LayerDefinition> &layers) {
        ActivationFactory* activationFactory = ActivationFactory::getInstance();
        this->inputSize = inputSize;
        this->layers.reserve(layers.size());
        int prevSize = inputSize;
        for (LayerDefinition layer : layers) {
            std::vector<Perceptron> tmp;
            tmp.reserve(layer.size);
            Activation* activation = activationFactory->getActivation(layer.activation);
            this->layers.emplace_back(layer.size, prevSize, activation);
            prevSize = layer.size;
        }
    }